

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O0

bool __thiscall basisu::basisu_frontend::compress(basisu_frontend *this)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined4 *in_RDI;
  uint32_t refine_selector_steps;
  uint32_t num_refine_selector_steps;
  char buf_1 [256];
  bool early_out;
  char buf [256];
  uint32_t refine_endpoint_step;
  basisu_frontend *in_stack_000003d0;
  uint local_230;
  char local_228 [8];
  basisu_frontend *in_stack_fffffffffffffde0;
  basisu_frontend *in_stack_fffffffffffffe00;
  basisu_frontend *in_stack_fffffffffffffe18;
  basisu_frontend *in_stack_fffffffffffffe40;
  basisu_frontend *in_stack_fffffffffffffe60;
  basisu_frontend *in_stack_fffffffffffffe78;
  basisu_frontend *in_stack_fffffffffffffec0;
  char local_118 [8];
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  basisu_frontend *in_stack_fffffffffffffef8;
  basisu_frontend *in_stack_ffffffffffffff50;
  basisu_frontend *in_stack_ffffffffffffff60;
  basisu_frontend *in_stack_ffffffffffffff90;
  basisu_frontend *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffd7;
  char *in_stack_ffffffffffffffd8;
  basisu_frontend *in_stack_ffffffffffffffe0;
  uint local_14;
  bool local_1;
  
  debug_printf("basisu_frontend::compress\n");
  in_RDI[0x10] = *in_RDI;
  in_RDI[0x11] = in_RDI[0x10] << 4;
  init_etc1_images(in_stack_fffffffffffffe60);
  if (*(long *)(in_RDI + 10) == 0) {
    init_endpoint_training_vectors(in_stack_fffffffffffffe40);
    generate_endpoint_clusters(in_stack_fffffffffffffe60);
    for (local_14 = 0; local_14 < (uint)in_RDI[0x13]; local_14 = local_14 + 1) {
      if ((*(byte *)(in_RDI + 8) & 1) != 0) {
        bVar3 = check_etc1s_constraints(in_stack_fffffffffffffe78);
        if (!bVar3) {
          handle_verify_failure(0);
        }
        bVar3 = validate_endpoint_cluster_hierarchy
                          (in_stack_fffffffffffffef8,(bool)in_stack_fffffffffffffef7);
        if (!bVar3) {
          handle_verify_failure(0);
        }
      }
      if (local_14 != 0) {
        introduce_new_endpoint_clusters(in_stack_ffffffffffffffc0);
      }
      if (((*(byte *)(in_RDI + 8) & 1) != 0) &&
         (bVar3 = validate_endpoint_cluster_hierarchy
                            (in_stack_fffffffffffffef8,(bool)in_stack_fffffffffffffef7), !bVar3)) {
        handle_verify_failure(0);
      }
      generate_endpoint_codebook((basisu_frontend *)buf._24_8_,buf._20_4_);
      if (((*(byte *)((long)in_RDI + 0x1e) & 1) != 0) && ((*(byte *)((long)in_RDI + 0x1f) & 1) != 0)
         ) {
        snprintf(local_118,0x100,"endpoint_cluster_vis_pre_%u.png",(ulong)local_14);
        dump_endpoint_clusterization_visualization
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                   (bool)in_stack_ffffffffffffffd7);
      }
      bVar3 = false;
      if ((*(byte *)(in_RDI + 0x12) & 1) != 0) {
        uVar4 = refine_endpoint_clusterization((basisu_frontend *)buf._96_8_);
        bVar3 = uVar4 == 0;
        if (((in_RDI[9] == 3) && (local_14 == 0)) && (in_RDI[0x13] == 1)) {
          eliminate_redundant_or_empty_endpoint_clusters
                    ((basisu_frontend *)
                     CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
          maximum<unsigned_int>(1,0);
          generate_endpoint_codebook((basisu_frontend *)buf._24_8_,buf._20_4_);
        }
        if (((*(byte *)((long)in_RDI + 0x1e) & 1) != 0) &&
           ((*(byte *)((long)in_RDI + 0x1f) & 1) != 0)) {
          snprintf(local_228,0x100,"endpoint_cluster_vis_post_%u.png",(ulong)local_14);
          dump_endpoint_clusterization_visualization
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                     (bool)in_stack_ffffffffffffffd7);
          snprintf(local_228,0x100,"endpoint_cluster_colors_vis_post_%u.png",(ulong)local_14);
          dump_endpoint_clusterization_visualization
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                     (bool)in_stack_ffffffffffffffd7);
        }
      }
      if (((*(byte *)(in_RDI + 8) & 1) != 0) &&
         (bVar2 = validate_endpoint_cluster_hierarchy
                            (in_stack_fffffffffffffef8,(bool)in_stack_fffffffffffffef7), !bVar2)) {
        handle_verify_failure(0);
      }
      eliminate_redundant_or_empty_endpoint_clusters
                ((basisu_frontend *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      if (((*(byte *)(in_RDI + 8) & 1) != 0) &&
         (bVar2 = validate_endpoint_cluster_hierarchy
                            (in_stack_fffffffffffffef8,(bool)in_stack_fffffffffffffef7), !bVar2)) {
        handle_verify_failure(0);
      }
      if ((*(byte *)((long)in_RDI + 0x1d) & 1) != 0) {
        uVar5 = vector<basisu::vector<unsigned_int>_>::size
                          ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x30));
        debug_printf("Total endpoint clusters: %u\n",(ulong)uVar5);
      }
      if (bVar3) break;
    }
    if (((*(byte *)(in_RDI + 8) & 1) != 0) &&
       (bVar3 = check_etc1s_constraints(in_stack_fffffffffffffe78), !bVar3)) {
      handle_verify_failure(0);
    }
    generate_block_endpoint_clusters(in_stack_fffffffffffffe00);
    create_initial_packed_texture(in_stack_fffffffffffffec0);
    generate_selector_clusters(in_stack_ffffffffffffff90);
    if ((*(byte *)((long)in_RDI + 0x4a) & 1) != 0) {
      compute_selector_clusters_within_each_parent_cluster(in_stack_fffffffffffffec0);
    }
    if (in_RDI[6] == 0) {
      create_optimized_selector_codebook((basisu_frontend *)buf_1._16_8_,buf_1._12_4_);
      find_optimal_selector_clusters_for_each_block((basisu_frontend *)buf._0_8_);
      introduce_special_selector_clusters(in_stack_ffffffffffffff50);
    }
    else {
      uVar1 = in_RDI[0x14];
      for (local_230 = 0; local_230 < uVar1; local_230 = local_230 + 1) {
        create_optimized_selector_codebook((basisu_frontend *)buf_1._16_8_,buf_1._12_4_);
        find_optimal_selector_clusters_for_each_block((basisu_frontend *)buf._0_8_);
        introduce_special_selector_clusters(in_stack_ffffffffffffff50);
        if (((3 < (uint)in_RDI[6]) || (in_RDI[9] == 3)) &&
           (uVar4 = refine_block_endpoints_given_selectors(in_stack_000003d0), uVar4 == 0)) break;
      }
    }
    optimize_selector_codebook((basisu_frontend *)buf_1._16_8_);
    if ((*(byte *)((long)in_RDI + 0x1d) & 1) != 0) {
      uVar5 = vector<basisu::vector<unsigned_int>_>::size
                        ((vector<basisu::vector<unsigned_int>_> *)(in_RDI + 0x48));
      debug_printf("Total selector clusters: %u\n",(ulong)uVar5);
    }
  }
  else {
    init_global_codebooks(in_stack_ffffffffffffff60);
  }
  finalize(in_stack_fffffffffffffde0);
  if (((*(byte *)(in_RDI + 8) & 1) == 0) ||
     (bVar3 = validate_output(in_stack_fffffffffffffe18), bVar3)) {
    debug_printf("basisu_frontend::compress: Done\n");
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool basisu_frontend::compress()
	{
		debug_printf("basisu_frontend::compress\n");

		m_total_blocks = m_params.m_num_source_blocks;
		m_total_pixels = m_total_blocks * cPixelBlockTotalPixels;

		// Encode the initial high quality ETC1S texture

		init_etc1_images();

		// First quantize the ETC1S endpoints

		if (m_params.m_pGlobal_codebooks)
		{
			init_global_codebooks();
		}
		else
		{
			init_endpoint_training_vectors();

			generate_endpoint_clusters();

			for (uint32_t refine_endpoint_step = 0; refine_endpoint_step < m_num_endpoint_codebook_iterations; refine_endpoint_step++)
			{
				if (m_params.m_validate)
				{
					BASISU_FRONTEND_VERIFY(check_etc1s_constraints());

					BASISU_FRONTEND_VERIFY(validate_endpoint_cluster_hierarchy(false));
				}

				if (refine_endpoint_step)
				{
					introduce_new_endpoint_clusters();
				}

				if (m_params.m_validate)
				{
					BASISU_FRONTEND_VERIFY(validate_endpoint_cluster_hierarchy(false));
				}

				generate_endpoint_codebook(refine_endpoint_step);

				if ((m_params.m_debug_images) && (m_params.m_dump_endpoint_clusterization))
				{
					char buf[256];
					snprintf(buf, sizeof(buf), "endpoint_cluster_vis_pre_%u.png", refine_endpoint_step);
					dump_endpoint_clusterization_visualization(buf, false);
				}

				bool early_out = false;

				if (m_endpoint_refinement)
				{
					//dump_endpoint_clusterization_visualization("endpoint_clusters_before_refinement.png");

					if (!refine_endpoint_clusterization())
						early_out = true;

					if ((m_params.m_tex_type == basist::cBASISTexTypeVideoFrames) && (!refine_endpoint_step) && (m_num_endpoint_codebook_iterations == 1))
					{
						eliminate_redundant_or_empty_endpoint_clusters();
						generate_endpoint_codebook(basisu::maximum(1U, refine_endpoint_step));
					}

					if ((m_params.m_debug_images) && (m_params.m_dump_endpoint_clusterization))
					{
						char buf[256];
						snprintf(buf, sizeof(buf), "endpoint_cluster_vis_post_%u.png", refine_endpoint_step);

						dump_endpoint_clusterization_visualization(buf, false);
						snprintf(buf, sizeof(buf), "endpoint_cluster_colors_vis_post_%u.png", refine_endpoint_step);

						dump_endpoint_clusterization_visualization(buf, true);
					}
				}

				if (m_params.m_validate)
				{
					BASISU_FRONTEND_VERIFY(validate_endpoint_cluster_hierarchy(false));
				}
						
				eliminate_redundant_or_empty_endpoint_clusters();

				if (m_params.m_validate)
				{
					BASISU_FRONTEND_VERIFY(validate_endpoint_cluster_hierarchy(false));
				}

				if (m_params.m_debug_stats)
					debug_printf("Total endpoint clusters: %u\n", (uint32_t)m_endpoint_clusters.size());

				if (early_out)
					break;
			}
			
			if (m_params.m_validate)
			{
				BASISU_FRONTEND_VERIFY(check_etc1s_constraints());
			}

			generate_block_endpoint_clusters();

			create_initial_packed_texture();

			// Now quantize the ETC1S selectors

			generate_selector_clusters();

			if (m_use_hierarchical_selector_codebooks)
				compute_selector_clusters_within_each_parent_cluster();
				
			if (m_params.m_compression_level == 0)
			{
				create_optimized_selector_codebook(0);

				find_optimal_selector_clusters_for_each_block();
							
				introduce_special_selector_clusters();
			}
			else
			{
				const uint32_t num_refine_selector_steps = m_num_selector_codebook_iterations;
				for (uint32_t refine_selector_steps = 0; refine_selector_steps < num_refine_selector_steps; refine_selector_steps++)
				{
					create_optimized_selector_codebook(refine_selector_steps);

					find_optimal_selector_clusters_for_each_block();

					introduce_special_selector_clusters();

					if ((m_params.m_compression_level >= 4) || (m_params.m_tex_type == basist::cBASISTexTypeVideoFrames))
					{
						if (!refine_block_endpoints_given_selectors())
							break;
					}
				}
			}
				
			optimize_selector_codebook();

			if (m_params.m_debug_stats)
				debug_printf("Total selector clusters: %u\n", (uint32_t)m_selector_cluster_block_indices.size());
		}

		finalize();

		if (m_params.m_validate)
		{
			if (!validate_output())
				return false;
		}

		debug_printf("basisu_frontend::compress: Done\n");

		return true;
	}